

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigCone.c
# Opt level: O3

void Saig_ManSupport_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  void **ppvVar4;
  uint uVar5;
  
  iVar2 = p->nTravIds;
  if (pObj->TravId != iVar2) {
    do {
      pObj->TravId = iVar2;
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar5 = uVar3 & 7;
      if (uVar5 == 1) {
        return;
      }
      if (uVar5 == 2) {
        if ((pObj->field_0).CioId < p->nTruePis) {
          return;
        }
        uVar3 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
        if ((-1 < (int)uVar3) && ((int)uVar3 < p->vCos->nSize)) {
          pvVar1 = p->vCos->pArray[uVar3];
          uVar3 = vSupp->nSize;
          if (uVar3 == vSupp->nCap) {
            if ((int)uVar3 < 0x10) {
              if (vSupp->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(vSupp->pArray,0x80);
              }
              vSupp->pArray = ppvVar4;
              vSupp->nCap = 0x10;
            }
            else {
              if (vSupp->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(vSupp->pArray,(ulong)uVar3 << 4);
              }
              vSupp->pArray = ppvVar4;
              vSupp->nCap = uVar3 * 2;
            }
          }
          else {
            ppvVar4 = vSupp->pArray;
          }
          iVar2 = vSupp->nSize;
          vSupp->nSize = iVar2 + 1;
          ppvVar4[iVar2] = pvVar1;
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((uVar3 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigCone.c"
                      ,0x3d,"void Saig_ManSupport_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      Saig_ManSupport_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupp);
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      iVar2 = p->nTravIds;
    } while (pObj->TravId != iVar2);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Counts the support size of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManSupport_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsLo(p,pObj) )
        {
            pObj = Saig_ManLi( p, Aig_ObjCioId(pObj)-Saig_ManPiNum(p) );
            Vec_PtrPush( vSupp, pObj );
        }
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManSupport_rec( p, Aig_ObjFanin0(pObj), vSupp );
    Saig_ManSupport_rec( p, Aig_ObjFanin1(pObj), vSupp );
}